

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

BasicBlock * __thiscall flow::IRBuilder::createBlock(IRBuilder *this,string *name)

{
  BasicBlock *pBVar1;
  string n;
  string local_30;
  
  makeName(&local_30,this,name);
  pBVar1 = IRHandler::createBlock(this->handler_,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pBVar1;
}

Assistant:

BasicBlock* IRBuilder::createBlock(const std::string& name) {
  std::string n = makeName(name);
  return handler_->createBlock(n);
}